

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O0

stats_data * __thiscall
foxxll::stats_data::operator+(stats_data *__return_storage_ptr__,stats_data *this,stats_data *a)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  back_insert_iterator<std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>_>
  bVar5;
  stats_data *a_local;
  stats_data *this_local;
  stats_data *s;
  
  stats_data(__return_storage_ptr__);
  cVar1 = std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::cbegin
                    (&this->file_stats_data_list_);
  cVar2 = std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::cend
                    (&this->file_stats_data_list_);
  cVar3 = std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::cbegin
                    (&a->file_stats_data_list_);
  cVar4 = std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::cend
                    (&a->file_stats_data_list_);
  bVar5 = std::
          back_inserter<std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>>
                    (&__return_storage_ptr__->file_stats_data_list_);
  tlx::operator+(cVar1._M_current,cVar2._M_current,cVar3._M_current,cVar4._M_current,bVar5.container
                );
  __return_storage_ptr__->p_reads_ = this->p_reads_ + a->p_reads_;
  __return_storage_ptr__->p_writes_ = this->p_writes_ + a->p_writes_;
  __return_storage_ptr__->p_ios_ = this->p_ios_ + a->p_ios_;
  __return_storage_ptr__->t_wait = this->t_wait + a->t_wait;
  __return_storage_ptr__->t_wait_read_ = this->t_wait_read_ + a->t_wait_read_;
  __return_storage_ptr__->t_wait_write_ = this->t_wait_write_ + a->t_wait_write_;
  __return_storage_ptr__->elapsed_ = this->elapsed_ + a->elapsed_;
  return __return_storage_ptr__;
}

Assistant:

stats_data stats_data::operator + (const stats_data& a) const
{
    stats_data s;

    tlx::merge_combine(
        file_stats_data_list_.cbegin(), file_stats_data_list_.cend(),
        a.file_stats_data_list_.cbegin(), a.file_stats_data_list_.cend(),
        std::back_inserter(s.file_stats_data_list_),
        FileStatsDataCompare(),
        [](const file_stats_data& a, const file_stats_data& b) {
            return a + b;
        }
    );

    s.p_reads_ = p_reads_ + a.p_reads_;
    s.p_writes_ = p_writes_ + a.p_writes_;
    s.p_ios_ = p_ios_ + a.p_ios_;
    s.t_wait = t_wait + a.t_wait;
    s.t_wait_read_ = t_wait_read_ + a.t_wait_read_;
    s.t_wait_write_ = t_wait_write_ + a.t_wait_write_;
    s.elapsed_ = elapsed_ + a.elapsed_;
    return s;
}